

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O2

Vec_Vec_t * Vec_VecAlloc(int nCap)

{
  Vec_Vec_t *pVVar1;
  void **ppvVar2;
  int iVar3;
  
  pVVar1 = (Vec_Vec_t *)malloc(0x10);
  iVar3 = 8;
  if (6 < nCap - 1U) {
    iVar3 = nCap;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar3;
  if (iVar3 == 0) {
    ppvVar2 = (void **)0x0;
  }
  else {
    ppvVar2 = (void **)malloc((long)iVar3 << 3);
  }
  pVVar1->pArray = ppvVar2;
  return pVVar1;
}

Assistant:

static inline Vec_Vec_t * Vec_VecAlloc( int nCap )
{
    Vec_Vec_t * p;
    p = ABC_ALLOC( Vec_Vec_t, 1 );
    if ( nCap > 0 && nCap < 8 )
        nCap = 8;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_ALLOC( void *, p->nCap ) : NULL;
    return p;
}